

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::Read
          (PosixRandomAccessFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  long lVar1;
  char *__file;
  Slice *pSVar2;
  Status *rhs;
  size_t in_RCX;
  __off_t in_RDX;
  long in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  string *in_R9;
  long in_FS_OFFSET;
  ssize_t read_size;
  int fd;
  Status *status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int error_number;
  Slice *this_00;
  string *in_stack_ffffffffffffff60;
  int local_54;
  undefined8 local_18;
  undefined8 local_10;
  
  error_number = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = *(int *)(in_RSI + 0xc);
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    __file = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (in_stack_ffffffffffffff48);
    local_54 = open(__file,0x80000);
    if (local_54 < 0) {
      __errno_location();
      PosixError(in_stack_ffffffffffffff60,error_number);
      goto LAB_018d01dc;
    }
  }
  if (local_54 == -1) {
    __assert_fail("fd != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                  ,0xb7,
                  "virtual Status leveldb::(anonymous namespace)::PosixRandomAccessFile::Read(uint64_t, size_t, Slice *, char *) const"
                 );
  }
  Status::Status((Status *)in_stack_ffffffffffffff48);
  pSVar2 = (Slice *)pread(local_54,in_R9,in_RCX,in_RDX);
  this_00 = pSVar2;
  if ((long)pSVar2 < 0) {
    this_00 = (Slice *)0x0;
  }
  Slice::Slice(this_00,in_stack_ffffffffffffff50,(size_t)in_stack_ffffffffffffff48);
  *in_R8 = local_18;
  in_R8[1] = local_10;
  if ((long)pSVar2 < 0) {
    rhs = (Status *)(in_RSI + 0x18);
    __errno_location();
    PosixError(in_R9,(int)((ulong)this_00 >> 0x20));
    Status::operator=((Status *)this_00,rhs);
    Status::~Status((Status *)in_stack_ffffffffffffff48);
  }
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    if (local_54 == *(int *)(in_RSI + 0xc)) {
      __assert_fail("fd != fd_",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0xc2,
                    "virtual Status leveldb::(anonymous namespace)::PosixRandomAccessFile::Read(uint64_t, size_t, Slice *, char *) const"
                   );
    }
    close(local_54);
  }
LAB_018d01dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    int fd = fd_;
    if (!has_permanent_fd_) {
      fd = ::open(filename_.c_str(), O_RDONLY | kOpenBaseFlags);
      if (fd < 0) {
        return PosixError(filename_, errno);
      }
    }

    assert(fd != -1);

    Status status;
    ssize_t read_size = ::pread(fd, scratch, n, static_cast<off_t>(offset));
    *result = Slice(scratch, (read_size < 0) ? 0 : read_size);
    if (read_size < 0) {
      // An error: return a non-ok status.
      status = PosixError(filename_, errno);
    }
    if (!has_permanent_fd_) {
      // Close the temporary file descriptor opened earlier.
      assert(fd != fd_);
      ::close(fd);
    }
    return status;
  }